

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_read_header_comment(p_ply ply)

{
  int iVar1;
  p_ply ply_local;
  
  if (((ply != (p_ply)0x0) && (ply->fp != (FILE *)0x0)) && (ply->io_mode == PLY_READ)) {
    iVar1 = strcmp(ply->buffer + ply->buffer_token,"comment");
    if (iVar1 == 0) {
      iVar1 = ply_read_line(ply);
      if (iVar1 == 0) {
        ply_local._4_4_ = 0;
      }
      else {
        iVar1 = ply_add_comment(ply,ply->buffer + ply->buffer_token);
        if (iVar1 == 0) {
          ply_local._4_4_ = 0;
        }
        else {
          iVar1 = ply_read_word(ply);
          if (iVar1 == 0) {
            ply_local._4_4_ = 0;
          }
          else {
            ply_local._4_4_ = 1;
          }
        }
      }
    }
    else {
      ply_local._4_4_ = 0;
    }
    return ply_local._4_4_;
  }
  __assert_fail("ply && ply->fp && ply->io_mode == PLY_READ",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x4be,"int ply_read_header_comment(p_ply)");
}

Assistant:

static int ply_read_header_comment(p_ply ply) {
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    if (strcmp(BWORD(ply), "comment")) return 0;
    if (!ply_read_line(ply)) return 0;
    if (!ply_add_comment(ply, BLINE(ply))) return 0;
    if (!ply_read_word(ply)) return 0;
    return 1;
}